

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_token(FILE *out,token *token)

{
  ulong local_20;
  size_t i;
  token *token_local;
  FILE *out_local;
  
  if (token != (token *)0x0) {
    for (local_20 = 0; local_20 < token->data_size; local_20 = local_20 + 1) {
      fprintf((FILE *)out,"%c",(ulong)(uint)(int)token->data[local_20]);
    }
  }
  return;
}

Assistant:

void print_token(FILE *out,struct token *token)
{
	size_t i;
//	fprintf(out,"[");
	if(token==NULL)return;
	for(i=0;i<token->data_size;++i)
	{
		fprintf(out,"%c",token->data[i]);
	}
//	fprintf(out,"]");
}